

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::inject_notification(Group *this,View *view,bool lock)

{
  atomic_int_fast64_t *paVar1;
  View *pVVar2;
  _Object *p_Var3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  mapped_type *pmVar7;
  long *plVar8;
  undefined3 in_register_00000011;
  ulong uVar9;
  float fVar10;
  float fVar11;
  Code *local_38;
  undefined4 extraout_var;
  
  if (CONCAT31(in_register_00000011,lock) != 0) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
  }
  local_38 = (Code *)r_exec::View::get_oid(view);
  pmVar7 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->notification_views,(key_type *)&local_38);
  pVVar2 = (View *)pmVar7->object;
  if (pVVar2 != view) {
    if (pVVar2 != (View *)0x0) {
      LOCK();
      paVar1 = &(pVVar2->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pVVar2->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
        (*(pVVar2->super_View).super__Object._vptr__Object[1])();
      }
    }
    pmVar7->object = (_Object *)view;
    LOCK();
    paVar1 = &(view->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  iVar5 = (*((view->super_View).object.object)->_vptr__Object[10])();
  if ((short)iVar5 != 0) {
    uVar9 = 0;
    do {
      p_Var3 = (view->super_View).object.object;
      iVar5 = (*p_Var3->_vptr__Object[9])(p_Var3,uVar9 & 0xffff);
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
      (**(code **)(*plVar8 + 0x98))(plVar8);
      local_38 = (Code *)(view->super_View).object.object;
      r_code::list<r_code::Code_*>::push_back((list<r_code::Code_*> *)(plVar8 + 3),&local_38);
      (**(code **)(*plVar8 + 0xa0))(plVar8);
      uVar9 = uVar9 + 1;
      uVar6 = (*((view->super_View).object.object)->_vptr__Object[10])();
    } while (uVar9 < (uVar6 & 0xffff));
  }
  uVar9 = (*Now)();
  uVar4 = r_code::Atom::asIndex();
  r_code::Utils::SetTimestamp
            ((Atom *)((long)(view->super_View).references + (ulong)uVar4 * 4 + 0x18),uVar9);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,5);
  fVar10 = (float)r_code::Atom::asFloat();
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,6);
  fVar11 = (float)r_code::Atom::asFloat();
  if (fVar11 < fVar10) {
    fVar10 = r_exec::View::get_sln(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    fVar11 = (float)r_code::Atom::asFloat();
    if (fVar11 < fVar10) {
      inject_reduction_jobs(this,view);
    }
  }
  if (lock) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  return;
}

Assistant:

void Group::inject_notification(View *view, bool lock)
{
    if (lock) {
        mutex.lock();
    }

    notification_views[view->get_oid()] = view;

    for (uint64_t i = 0; i < view->object->references_size(); ++i) {
        Code *ref = view->object->get_reference(i);
        ref->acq_markers();
        ref->markers.push_back(view->object);
        ref->rel_markers();
    }

    view->set_ijt(Now());

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        inject_reduction_jobs(view);
    }

    if (lock) {
        mutex.unlock();
    }
}